

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_buildFSETable_body_bmi2
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize)

{
  short sVar1;
  sbyte sVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 uVar12;
  uint uVar13;
  size_t u;
  long lVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  undefined1 in_XMM0 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa655,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa656,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa657,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar8 = maxSymbolValue + 1;
  uVar5 = 1 << (tableLog & 0x1f);
  lVar9 = (long)wksp + 0x6a;
  sVar2 = ((byte)tableLog < 0x21) * (' ' - (byte)tableLog);
  uVar10 = (uint)(-1 << sVar2) >> sVar2;
  uVar12 = 1;
  uVar17 = 0;
  uVar15 = uVar10;
  do {
    uVar4 = normalizedCounter[uVar17];
    if (uVar4 == 0xffff) {
      uVar7 = (ulong)uVar15;
      uVar15 = uVar15 - 1;
      dt[uVar7 + 1].baseValue = (U32)uVar17;
      uVar4 = 1;
    }
    else {
      if ((short)uVar4 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa665,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if ((0x10000 << (tableLog - 1 & 0x1f)) >> 0x10 <= (int)(uint)uVar4) {
        uVar12 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar17 * 2) = uVar4;
    uVar17 = uVar17 + 1;
  } while (uVar8 != uVar17);
  dt->nextState = (short)uVar12;
  dt->nbAdditionalBits = (char)((uint)uVar12 >> 0x10);
  dt->nbBits = (char)((uint)uVar12 >> 0x18);
  dt->baseValue = tableLog;
  auVar3 = _DAT_0027d800;
  if (uVar15 == uVar10) {
    iVar16 = (uVar5 >> 3) + (uVar5 >> 1) + 3;
    lVar14 = 0;
    auVar18 = pmovsxbq(in_XMM0,0x100);
    uVar17 = (ulong)(0 >> sVar2);
    uVar15 = 0;
    do {
      uVar4 = normalizedCounter[uVar15];
      *(ulong *)(lVar9 + lVar14) = uVar17;
      if (8 < (long)(short)uVar4) {
        uVar6 = 0x10;
        if (0x10 < uVar4) {
          uVar6 = uVar4;
        }
        uVar7 = (ulong)uVar6 - 9;
        auVar21._8_4_ = (int)uVar7;
        auVar21._0_8_ = uVar7;
        auVar21._12_4_ = (int)(uVar7 >> 0x20);
        auVar19._0_8_ = uVar7 >> 3;
        auVar19._8_8_ = auVar21._8_8_ >> 3;
        auVar19 = auVar19 ^ auVar3;
        uVar11 = 0;
        do {
          auVar20._8_4_ = (int)uVar11;
          auVar20._0_8_ = uVar11;
          auVar20._12_4_ = (int)(uVar11 >> 0x20);
          auVar21 = (auVar20 | auVar18) ^ auVar3;
          if ((bool)(~(auVar19._4_4_ < auVar21._4_4_ ||
                      auVar19._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar19._4_4_) & 1)) {
            *(ulong *)(lVar9 + lVar14 + 8 + uVar11 * 8) = uVar17;
          }
          if (auVar21._12_4_ <= auVar19._12_4_ &&
              (auVar21._8_4_ <= auVar19._8_4_ || auVar21._12_4_ != auVar19._12_4_)) {
            *(ulong *)(lVar9 + lVar14 + 0x10 + uVar11 * 8) = uVar17;
          }
          uVar11 = uVar11 + 2;
        } while (((uVar7 >> 3) + 2 & 0xfffffffffffffffe) != uVar11);
      }
      if ((short)uVar4 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa687,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar14 = lVar14 + (short)uVar4;
      uVar15 = uVar15 + 1;
      uVar17 = uVar17 + 0x101010101010101;
    } while (uVar15 != uVar8 + (uVar8 == 0));
    if ((uVar5 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa695,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar17 = 0;
    uVar15 = 0;
    do {
      lVar14 = 0;
      uVar8 = uVar15;
      do {
        dt[(ulong)(uVar8 & uVar10) + 1].baseValue = (uint)*(byte *)(lVar9 + lVar14);
        lVar14 = lVar14 + 1;
        uVar8 = uVar8 + iVar16;
      } while (lVar14 == 1);
      uVar15 = uVar15 + iVar16 * 2 & uVar10;
      uVar17 = uVar17 + 2;
      lVar9 = lVar9 + 2;
    } while (uVar17 < uVar5);
    if (uVar15 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa69e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar17 = 0;
    uVar13 = 0;
    do {
      sVar1 = normalizedCounter[uVar17];
      if (0 < sVar1) {
        iVar16 = 0;
        do {
          dt[(ulong)uVar13 + 1].baseValue = (U32)uVar17;
          do {
            uVar13 = uVar13 + (uVar5 >> 3) + (uVar5 >> 1) + 3 & uVar10;
          } while (uVar15 < uVar13);
          iVar16 = iVar16 + 1;
        } while (iVar16 != sVar1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar8 + (uVar8 == 0));
    if (uVar13 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa6ac,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar17 = 0;
  while( true ) {
    uVar7 = (ulong)dt[uVar17 + 1].baseValue;
    uVar4 = *(ushort *)((long)wksp + uVar7 * 2);
    *(ushort *)((long)wksp + uVar7 * 2) = uVar4 + 1;
    iVar16 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar16 == 0; iVar16 = iVar16 + -1) {
      }
    }
    dt[uVar17 + 1].nbBits = (BYTE)(tableLog - iVar16);
    dt[uVar17 + 1].nextState = (uVar4 << (tableLog - iVar16 & 0x1f)) - (short)uVar5;
    if (nbAdditionalBits[uVar7] == 0xff) break;
    dt[uVar17 + 1].nbAdditionalBits = nbAdditionalBits[uVar7];
    dt[uVar17 + 1].baseValue = baseValue[uVar7];
    uVar17 = uVar17 + 1;
    if (uVar5 == uVar17) {
      return;
    }
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xa6b7,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

BMI2_TARGET_ATTRIBUTE static void ZSTD_buildFSETable_body_bmi2(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize)
{
    ZSTD_buildFSETable_body(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}